

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void test_hmac_sha256(void)

{
  ptls_cipher_suite_t *ppVar1;
  ptls_cipher_suite_t **pppVar2;
  ptls_hash_context_t *ppVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint8_t digest [32];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pppVar2 = ctx->cipher_suites;
  do {
    ppVar1 = *pppVar2;
    pppVar2 = pppVar2 + 1;
  } while (ppVar1->id != 0x1301);
  ppVar3 = ptls_hmac_create(ppVar1->hash,"\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v",0x14);
  local_58 = ZEXT816(0);
  local_48 = ZEXT816(0);
  (*ppVar3->update)(ppVar3,"Hi There",8);
  (*ppVar3->final)(ppVar3,local_58,PTLS_HASH_FINAL_MODE_RESET);
  auVar4[0] = -(local_48[0] == -0x78);
  auVar4[1] = -(local_48[1] == '\x1d');
  auVar4[2] = -(local_48[2] == -0x3e);
  auVar4[3] = -(local_48[3] == '\0');
  auVar4[4] = -(local_48[4] == -0x37);
  auVar4[5] = -(local_48[5] == -0x7d);
  auVar4[6] = -(local_48[6] == '=');
  auVar4[7] = -(local_48[7] == -0x59);
  auVar4[8] = -(local_48[8] == '&');
  auVar4[9] = -(local_48[9] == -0x17);
  auVar4[10] = -(local_48[10] == '7');
  auVar4[0xb] = -(local_48[0xb] == 'l');
  auVar4[0xc] = -(local_48[0xc] == '.');
  auVar4[0xd] = -(local_48[0xd] == '2');
  auVar4[0xe] = -(local_48[0xe] == -0x31);
  auVar4[0xf] = -(local_48[0xf] == -9);
  auVar7[0] = -(local_58[0] == -0x50);
  auVar7[1] = -(local_58[1] == '4');
  auVar7[2] = -(local_58[2] == 'L');
  auVar7[3] = -(local_58[3] == 'a');
  auVar7[4] = -(local_58[4] == -0x28);
  auVar7[5] = -(local_58[5] == -0x25);
  auVar7[6] = -(local_58[6] == '8');
  auVar7[7] = -(local_58[7] == 'S');
  auVar7[8] = -(local_58[8] == '\\');
  auVar7[9] = -(local_58[9] == -0x58);
  auVar7[10] = -(local_58[10] == -0x51);
  auVar7[0xb] = -(local_58[0xb] == -0x32);
  auVar7[0xc] = -(local_58[0xc] == -0x51);
  auVar7[0xd] = -(local_58[0xd] == '\v');
  auVar7[0xe] = -(local_58[0xe] == -0xf);
  auVar7[0xf] = -(local_58[0xf] == '+');
  auVar7 = auVar7 & auVar4;
  _ok((uint)((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5f);
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  (*ppVar3->update)(ppVar3,"Hi There",8);
  (*ppVar3->final)(ppVar3,local_58,PTLS_HASH_FINAL_MODE_RESET);
  auVar5[0] = -(local_48[0] == -0x78);
  auVar5[1] = -(local_48[1] == '\x1d');
  auVar5[2] = -(local_48[2] == -0x3e);
  auVar5[3] = -(local_48[3] == '\0');
  auVar5[4] = -(local_48[4] == -0x37);
  auVar5[5] = -(local_48[5] == -0x7d);
  auVar5[6] = -(local_48[6] == '=');
  auVar5[7] = -(local_48[7] == -0x59);
  auVar5[8] = -(local_48[8] == '&');
  auVar5[9] = -(local_48[9] == -0x17);
  auVar5[10] = -(local_48[10] == '7');
  auVar5[0xb] = -(local_48[0xb] == 'l');
  auVar5[0xc] = -(local_48[0xc] == '.');
  auVar5[0xd] = -(local_48[0xd] == '2');
  auVar5[0xe] = -(local_48[0xe] == -0x31);
  auVar5[0xf] = -(local_48[0xf] == -9);
  auVar8[0] = -(local_58[0] == -0x50);
  auVar8[1] = -(local_58[1] == '4');
  auVar8[2] = -(local_58[2] == 'L');
  auVar8[3] = -(local_58[3] == 'a');
  auVar8[4] = -(local_58[4] == -0x28);
  auVar8[5] = -(local_58[5] == -0x25);
  auVar8[6] = -(local_58[6] == '8');
  auVar8[7] = -(local_58[7] == 'S');
  auVar8[8] = -(local_58[8] == '\\');
  auVar8[9] = -(local_58[9] == -0x58);
  auVar8[10] = -(local_58[10] == -0x51);
  auVar8[0xb] = -(local_58[0xb] == -0x32);
  auVar8[0xc] = -(local_58[0xc] == -0x51);
  auVar8[0xd] = -(local_58[0xd] == '\v');
  auVar8[0xe] = -(local_58[0xe] == -0xf);
  auVar8[0xf] = -(local_58[0xf] == '+');
  auVar8 = auVar8 & auVar5;
  _ok((uint)((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",100);
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  (*ppVar3->update)(ppVar3,"Hi There",8);
  (*ppVar3->final)(ppVar3,local_58,PTLS_HASH_FINAL_MODE_FREE);
  auVar9[0] = -(local_48[0] == -0x78);
  auVar9[1] = -(local_48[1] == '\x1d');
  auVar9[2] = -(local_48[2] == -0x3e);
  auVar9[3] = -(local_48[3] == '\0');
  auVar9[4] = -(local_48[4] == -0x37);
  auVar9[5] = -(local_48[5] == -0x7d);
  auVar9[6] = -(local_48[6] == '=');
  auVar9[7] = -(local_48[7] == -0x59);
  auVar9[8] = -(local_48[8] == '&');
  auVar9[9] = -(local_48[9] == -0x17);
  auVar9[10] = -(local_48[10] == '7');
  auVar9[0xb] = -(local_48[0xb] == 'l');
  auVar9[0xc] = -(local_48[0xc] == '.');
  auVar9[0xd] = -(local_48[0xd] == '2');
  auVar9[0xe] = -(local_48[0xe] == -0x31);
  auVar9[0xf] = -(local_48[0xf] == -9);
  auVar6[0] = -(local_58[0] == -0x50);
  auVar6[1] = -(local_58[1] == '4');
  auVar6[2] = -(local_58[2] == 'L');
  auVar6[3] = -(local_58[3] == 'a');
  auVar6[4] = -(local_58[4] == -0x28);
  auVar6[5] = -(local_58[5] == -0x25);
  auVar6[6] = -(local_58[6] == '8');
  auVar6[7] = -(local_58[7] == 'S');
  auVar6[8] = -(local_58[8] == '\\');
  auVar6[9] = -(local_58[9] == -0x58);
  auVar6[10] = -(local_58[10] == -0x51);
  auVar6[0xb] = -(local_58[0xb] == -0x32);
  auVar6[0xc] = -(local_58[0xc] == -0x51);
  auVar6[0xd] = -(local_58[0xd] == '\v');
  auVar6[0xe] = -(local_58[0xe] == -0xf);
  auVar6[0xf] = -(local_58[0xf] == '+');
  auVar6 = auVar6 & auVar9;
  _ok((uint)((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x69);
  return;
}

Assistant:

static void test_hmac_sha256(void)
{
    /* test vector from RFC 4231 */
    const char *secret = "\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b", *message = "Hi There",
               *expected =
                   "\xb0\x34\x4c\x61\xd8\xdb\x38\x53\x5c\xa8\xaf\xce\xaf\x0b\xf1\x2b\x88\x1d\xc2\x00\xc9\x83\x3d\xa7\x26\xe9\x37"
                   "\x6c\x2e\x32\xcf\xf7";
    uint8_t digest[32];

    ptls_hash_context_t *hctx =
        ptls_hmac_create(find_cipher(ctx, PTLS_CIPHER_SUITE_AES_128_GCM_SHA256)->hash, secret, strlen(secret));

    memset(digest, 0, sizeof(digest));
    hctx->update(hctx, message, strlen(message));
    hctx->final(hctx, digest, PTLS_HASH_FINAL_MODE_RESET);
    ok(memcmp(digest, expected, 32) == 0);

    memset(digest, 0, sizeof(digest));
    hctx->update(hctx, message, strlen(message));
    hctx->final(hctx, digest, PTLS_HASH_FINAL_MODE_RESET);
    ok(memcmp(digest, expected, 32) == 0);

    memset(digest, 0, sizeof(digest));
    hctx->update(hctx, message, strlen(message));
    hctx->final(hctx, digest, PTLS_HASH_FINAL_MODE_FREE);
    ok(memcmp(digest, expected, 32) == 0);
}